

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O2

void __thiscall ASTree::toDot(ASTree *this,string *filename)

{
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  Graph local_68;
  
  local_68.rankdir._M_dataplus._M_p = (pointer)&local_68.rankdir.field_2;
  local_68.rankdir._M_string_length = 0;
  local_68.rankdir.field_2._8_8_ = 0;
  local_68.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.rankdir.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"TB",&local_a9);
  Graph::setRankdir(&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  expandDot(this,&local_68);
  std::__cxx11::string::string((string *)&local_a8,(string *)filename);
  Graph::build_file(&local_68,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  Graph::~Graph(&local_68);
  return;
}

Assistant:

void ASTree::toDot(std::string filename) {
    Graph graph = Graph();
    graph.setRankdir("TB");
    expandDot(graph);
    graph.build_file(filename);
}